

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::DataPageHeaderV2::DataPageHeaderV2(DataPageHeaderV2 *this)

{
  Statistics *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__DataPageHeaderV2_00c01a98;
  *(undefined ***)in_RDI = &PTR__DataPageHeaderV2_00c01a98;
  *(undefined4 *)&in_RDI->max = 0;
  *(undefined4 *)&in_RDI->field_0xc = 0;
  *(undefined4 *)&in_RDI->field_0x10 = 0;
  *(undefined4 *)&in_RDI->field_0x14 = 0;
  *(undefined4 *)&in_RDI->field_0x18 = 0;
  *(undefined4 *)&in_RDI->field_0x1c = 0;
  in_RDI->field_0x20 = 1;
  Statistics::Statistics(in_RDI);
  _DataPageHeaderV2__isset::_DataPageHeaderV2__isset((_DataPageHeaderV2__isset *)&in_RDI[1].min);
  return;
}

Assistant:

DataPageHeaderV2::DataPageHeaderV2() noexcept
   : num_values(0),
     num_nulls(0),
     num_rows(0),
     encoding(static_cast<Encoding::type>(0)),
     definition_levels_byte_length(0),
     repetition_levels_byte_length(0),
     is_compressed(true) {
}